

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O1

void anon_unknown.dwarf_69847d::CNNTest::RunMultiOutCNNTest
               (float **input,int image_width,int image_height,int in_stride,CNN_CONFIG *cnn_config,
               CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output,float **expected,double tolerance)

{
  float *pfVar1;
  char cVar2;
  size_type sVar3;
  float *pfVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  SEARCH_METHODS *pSVar11;
  CNN_THREAD_DATA *expected_predicate_value;
  int iVar12;
  long lVar13;
  float fVar14;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int *out_heights;
  int *not_used;
  int *out_widths;
  CNN_MULTI_OUT *expr1;
  double in_stack_ffffffffffffff20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var15;
  char *abs_error_expr;
  char *pcVar16;
  AssertHelper local_c0;
  string local_b8;
  int local_94;
  CNN_THREAD_DATA *local_90;
  int *local_88;
  ulong local_80;
  int *local_78;
  int *local_70;
  uint local_64;
  size_t local_60;
  size_t local_58;
  int *local_50;
  float *local_48;
  long local_40;
  double local_38;
  
  local_80 = CONCAT44(local_80._4_4_,in_stride);
  sVar9 = (size_t)output->num_outputs;
  local_50 = output->output_channels;
  local_90 = thread_data;
  local_38 = tolerance;
  local_70 = (int *)aom_calloc(sVar9,4);
  local_88 = (int *)aom_calloc(sVar9,4);
  local_60 = sVar9;
  local_78 = (int *)aom_calloc(sVar9,4);
  _Var15._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<int*,decltype(nullptr)>
            ((internal *)&local_b8,"out_widths","nullptr",&local_70,
             (void **)&stack0xffffffffffffff30);
  sVar3 = local_b8._M_string_length;
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff30);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pSVar11 = "";
    }
    else {
      pSVar11 = *(SEARCH_METHODS **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
               ,0x55,(char *)pSVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&stack0xffffffffffffff30);
  }
  else {
    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_b8._M_string_length !=
          (undefined8 *)(local_b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_b8._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
    _Var15._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              ((internal *)&local_b8,"out_heights","nullptr",&local_88,
               (void **)&stack0xffffffffffffff30);
    sVar3 = local_b8._M_string_length;
    if ((char)local_b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffff30);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pSVar11 = "";
      }
      else {
        pSVar11 = *(SEARCH_METHODS **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x56,(char *)pSVar11);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&stack0xffffffffffffff30);
    }
    else {
      if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_b8._M_string_length !=
            (undefined8 *)(local_b8._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_b8._M_string_length);
        }
        operator_delete((void *)sVar3);
      }
      _Var15._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((internal *)&local_b8,"not_used","nullptr",&local_78,
                 (void **)&stack0xffffffffffffff30);
      sVar3 = local_b8._M_string_length;
      if ((char)local_b8._M_dataplus._M_p != '\0') {
        if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_b8._M_string_length !=
              (undefined8 *)(local_b8._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_b8._M_string_length);
          }
          operator_delete((void *)sVar3);
        }
        av1_find_cnn_output_size(image_width,image_height,cnn_config,local_70,local_88,local_78);
        expected_predicate_value = local_90;
        expr1 = output;
        _Var5 = av1_cnn_predict_c(input,image_width,image_height,(int)local_80,cnn_config,local_90,
                                  output);
        abs_error_expr = (char *)0x0;
        if (!_Var5) {
          testing::Message::Message((Message *)&stack0xffffffffffffff28);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b8,(internal *)&stack0xffffffffffffff30,
                     (AssertionResult *)
                     "av1_cnn_predict_c(input, image_width, image_height, in_stride, cnn_config, thread_data, output)"
                     ,"false","true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                     ,0x5c,(char *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,
                                            (char)local_b8._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&stack0xffffffffffffff28);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          pcVar16 = abs_error_expr;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,(char)local_b8._M_dataplus._M_p) !=
              &local_b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_b8._M_dataplus._M_p._1_7_,(char)local_b8._M_dataplus._M_p
                                    ));
            pcVar16 = abs_error_expr;
          }
          if (in_stack_ffffffffffffff28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
          }
          abs_error_expr = pcVar16;
          if (pcVar16 != (char *)0x0) {
            if (*(char **)pcVar16 != pcVar16 + 0x10) {
              operator_delete(*(char **)pcVar16);
            }
            operator_delete(pcVar16);
          }
          if (!_Var5) {
            return;
          }
        }
        if (0 < (int)local_60) {
          sVar9 = 0;
          lVar13 = 0;
          do {
            local_48 = expected[sVar9];
            local_94 = local_50[sVar9];
            uVar6 = local_88[sVar9] * local_70[sVar9];
            _Var15._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (0 < local_94) {
              lVar13 = (long)(int)lVar13;
              uVar8 = (ulong)uVar6;
              uVar7 = 0;
              iVar12 = 0;
              local_90 = (CNN_THREAD_DATA *)CONCAT44(local_90._4_4_,uVar6);
              local_58 = sVar9;
              do {
                pfVar4 = local_48;
                if (0 < (int)uVar6) {
                  pfVar1 = output->output_buffer[lVar13];
                  local_80 = (ulong)uVar7;
                  uVar10 = 0;
                  local_64 = uVar7;
                  local_40 = lVar13;
                  do {
                    testing::internal::DoubleNearPredFormat
                              ((char *)expr1,(char *)0x4c46fa,abs_error_expr,
                               (double)_Var15._M_head_impl,
                               (double)in_stack_ffffffffffffff28._M_head_impl,
                               in_stack_ffffffffffffff20);
                    if ((char)local_b8._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&stack0xffffffffffffff28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)((long)in_stack_ffffffffffffff28._M_head_impl + 0x10),
                                 " output ",8);
                      std::ostream::operator<<
                                (&((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line
                                 ,(int)local_58);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)((long)in_stack_ffffffffffffff28._M_head_impl + 0x10),
                                 " channel ",9);
                      std::ostream::operator<<(in_stack_ffffffffffffff28._M_head_impl + 0x10,iVar12)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line
                                 ," pixel ",7);
                      std::ostream::operator<<
                                (in_stack_ffffffffffffff28._M_head_impl + 0x10,
                                 ((int)local_80 + (int)uVar10) % (int)(uint)local_90);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line
                                 ,": ",2);
                      std::ostream::_M_insert<double>((double)pfVar4[(long)(int)uVar7 + uVar10]);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line
                                 ,"/",1);
                      std::ostream::_M_insert<double>((double)pfVar1[uVar10]);
                      cVar2 = (char)in_stack_ffffffffffffff28._M_head_impl + '\x10';
                      std::ios::widen((char)*(undefined8 *)
                                             (*(long *)(in_stack_ffffffffffffff28._M_head_impl +
                                                       0x10) + -0x18) + cVar2);
                      std::ostream::put(cVar2);
                      std::ostream::flush();
                      pSVar11 = "";
                      if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
                        pSVar11 = *(SEARCH_METHODS **)local_b8._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_c0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                                 ,0x6b,(char *)pSVar11);
                      testing::internal::AssertHelper::operator=
                                (&local_c0,(Message *)&stack0xffffffffffffff28);
                      testing::internal::AssertHelper::~AssertHelper(&local_c0);
                      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )in_stack_ffffffffffffff28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
                      }
                    }
                    sVar3 = local_b8._M_string_length;
                    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
                      if (*(undefined8 **)local_b8._M_string_length !=
                          (undefined8 *)(local_b8._M_string_length + 0x10)) {
                        operator_delete(*(undefined8 **)local_b8._M_string_length);
                      }
                      operator_delete((void *)sVar3);
                    }
                    fVar14 = pfVar4[(long)(int)uVar7 + uVar10] - pfVar1[uVar10];
                    _Var15._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((double)(fVar14 * fVar14) + _Var15._M_head_impl);
                    uVar10 = uVar10 + 1;
                  } while (uVar8 != uVar10);
                  uVar7 = local_64 + (int)uVar10;
                  lVar13 = local_40;
                  uVar6 = (uint)local_90;
                }
                lVar13 = lVar13 + 1;
                iVar12 = iVar12 + 1;
                sVar9 = local_58;
              } while (iVar12 != local_94);
            }
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&local_b8,"mse","tolerance",(double *)&stack0xffffffffffffff30,
                       &local_38);
            if ((char)local_b8._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&stack0xffffffffffffff28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((AssertHelperData *)in_stack_ffffffffffffff28._M_head_impl)->line,
                         " output ",8);
              std::ostream::operator<<(in_stack_ffffffffffffff28._M_head_impl + 0x10,(int)sVar9);
              cVar2 = (char)in_stack_ffffffffffffff28._M_head_impl + '\x10';
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)&((AssertHelperData *)
                                                in_stack_ffffffffffffff28._M_head_impl)->line +
                                     -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              pSVar11 = "";
              if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
                pSVar11 = *(SEARCH_METHODS **)local_b8._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                         ,0x76,(char *)pSVar11);
              testing::internal::AssertHelper::operator=
                        (&local_c0,(Message *)&stack0xffffffffffffff28);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if (in_stack_ffffffffffffff28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)in_stack_ffffffffffffff28._M_head_impl + 8))();
              }
            }
            sVar3 = local_b8._M_string_length;
            if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_b8._M_string_length !=
                  (undefined8 *)(local_b8._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_b8._M_string_length);
              }
              operator_delete((void *)sVar3);
            }
            sVar9 = sVar9 + 1;
          } while (sVar9 != local_60);
        }
        aom_free(local_70);
        aom_free(local_88);
        aom_free(local_78);
        return;
      }
      testing::Message::Message((Message *)&stack0xffffffffffffff30);
      if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
        pSVar11 = "";
      }
      else {
        pSVar11 = *(SEARCH_METHODS **)local_b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x57,(char *)pSVar11);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff28,(Message *)&stack0xffffffffffffff30);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
  if (_Var15._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var15._M_head_impl + 8))();
  }
  if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_b8._M_string_length !=
        (undefined8 *)(local_b8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_b8._M_string_length);
    }
    operator_delete((void *)local_b8._M_string_length);
  }
  return;
}

Assistant:

static void RunMultiOutCNNTest(const float **input, int image_width,
                                 int image_height, int in_stride,
                                 const CNN_CONFIG *cnn_config,
                                 CNN_THREAD_DATA *thread_data,
                                 CNN_MULTI_OUT *output, const float **expected,
                                 double tolerance) {
    const int num_outputs = output->num_outputs;
    const int *output_chs = output->output_channels;

    int *out_widths = (int *)aom_calloc(num_outputs, sizeof(*out_widths));
    int *out_heights = (int *)aom_calloc(num_outputs, sizeof(*out_heights));
    int *not_used = (int *)aom_calloc(num_outputs, sizeof(*not_used));
    ASSERT_NE(out_widths, nullptr);
    ASSERT_NE(out_heights, nullptr);
    ASSERT_NE(not_used, nullptr);

    av1_find_cnn_output_size(image_width, image_height, cnn_config, out_widths,
                             out_heights, not_used);
    ASSERT_TRUE(av1_cnn_predict(input, image_width, image_height, in_stride,
                                cnn_config, thread_data, output));

    int channel_offset = 0;
    for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
      const float *expected_out = expected[output_idx];
      const int curr_output_chs = output_chs[output_idx];
      const int out_size = out_widths[output_idx] * out_heights[output_idx];

      double mse = 0;
      int expected_ite = 0;
      for (int channel = 0; channel < curr_output_chs; ++channel) {
        const float *buf_out = output->output_buffer[channel_offset];

        for (int i = 0; i < out_size; ++i) {
          EXPECT_NEAR(expected_out[expected_ite], buf_out[i],
                      PIXELWISE_FLOAT_TOL)
              << " output " << output_idx << " channel " << channel << " pixel "
              << expected_ite % out_size << ": " << expected_out[expected_ite]
              << "/" << buf_out[i] << std::endl;
          mse += SQR(expected_out[expected_ite] - buf_out[i]);
          expected_ite++;
        }

        channel_offset++;
      }
      mse /= (out_size * curr_output_chs);
      EXPECT_LE(mse, tolerance) << " output " << output_idx << std::endl;
    }

    aom_free(out_widths);
    aom_free(out_heights);
    aom_free(not_used);
  }